

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O3

void Abc_NtkFraigPartitionedTime(Abc_Ntk_t *pNtk,void *pParams)

{
  int iVar1;
  Vec_Ptr_t *__ptr;
  Abc_Frame_t *pAVar2;
  Vec_Ptr_t *vOutsPtr;
  void **ppvVar3;
  uint *__ptr_00;
  void *pvVar4;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pAVar5;
  long lVar6;
  long lVar7;
  int level;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  timespec ts;
  timespec local_48;
  void *local_38;
  
  local_38 = pParams;
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                  ,0x491,"void Abc_NtkFraigPartitionedTime(Abc_Ntk_t *, void *)");
  }
  uVar10 = 0;
  __ptr = Abc_NtkPartitionSmart(pNtk,300,0);
  pAVar2 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar2,"unset progressbar");
  vOutsPtr = (Vec_Ptr_t *)malloc(0x10);
  vOutsPtr->nCap = 1000;
  vOutsPtr->nSize = 0;
  ppvVar3 = (void **)malloc(8000);
  vOutsPtr->pArray = ppvVar3;
  uVar9 = __ptr->nSize;
  __ptr_00 = (uint *)malloc(0x10);
  uVar8 = 8;
  if (6 < uVar9 - 1) {
    uVar8 = (ulong)uVar9;
  }
  __ptr_00[1] = 0;
  if ((int)uVar8 == 0) {
    pvVar4 = (void *)0x0;
  }
  else {
    pvVar4 = malloc((long)(int)uVar8 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar4;
  if ((int)uVar9 < 1) {
LAB_002ecac9:
    uVar9 = (uint)uVar10;
    ppvVar3 = __ptr->pArray;
    if (ppvVar3 != (void **)0x0) goto LAB_002ecad7;
  }
  else {
    uVar10 = 0;
    do {
      Abc_NtkConvertCos(pNtk,(Vec_Int_t *)__ptr->pArray[uVar10],vOutsPtr);
      pNtk_00 = Abc_NtkCreateConeArray(pNtk,vOutsPtr,0);
      pAVar5 = Abc_NtkFraig(pNtk_00,local_38,0,0);
      iVar1 = (int)uVar8;
      if ((int)uVar10 == iVar1) {
        if (iVar1 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar4 = malloc(0x80);
          }
          else {
            pvVar4 = realloc(*(void **)(__ptr_00 + 2),0x80);
          }
          *(void **)(__ptr_00 + 2) = pvVar4;
          *__ptr_00 = 0x10;
          uVar8 = 0x10;
        }
        else {
          uVar8 = (ulong)(uint)(iVar1 * 2);
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar4 = malloc(uVar8 * 8);
          }
          else {
            pvVar4 = realloc(*(void **)(__ptr_00 + 2),uVar8 * 8);
          }
          *(void **)(__ptr_00 + 2) = pvVar4;
          *__ptr_00 = iVar1 * 2;
        }
      }
      else {
        pvVar4 = *(void **)(__ptr_00 + 2);
      }
      *(Abc_Ntk_t **)((long)pvVar4 + uVar10 * 8) = pAVar5;
      Abc_NtkDelete(pNtk_00);
      uVar10 = uVar10 + 1;
      printf("Finished part %5d (out of %5d)\r",uVar10 & 0xffffffff,(ulong)uVar9);
    } while (uVar9 != uVar10);
    if ((int)uVar9 < 1) goto LAB_002ecac9;
    ppvVar3 = __ptr->pArray;
    uVar8 = 0;
    do {
      pvVar4 = ppvVar3[uVar8];
      if (pvVar4 != (void *)0x0) {
        if (*(void **)((long)pvVar4 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar4 + 8));
        }
        free(pvVar4);
      }
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
LAB_002ecad7:
    uVar9 = (uint)uVar10;
    free(ppvVar3);
  }
  free(__ptr);
  pAVar2 = Abc_FrameGetGlobalFrame();
  Cmd_CommandExecute(pAVar2,"set progressbar");
  pvVar4 = *(void **)(__ptr_00 + 2);
  if ((int)uVar9 < 1) {
    if (pvVar4 == (void *)0x0) goto LAB_002ecb32;
  }
  else {
    uVar8 = 0;
    do {
      Abc_NtkDelete(*(Abc_Ntk_t **)((long)pvVar4 + uVar8 * 8));
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  free(pvVar4);
LAB_002ecb32:
  free(__ptr_00);
  if (vOutsPtr->pArray != (void **)0x0) {
    free(vOutsPtr->pArray);
  }
  free(vOutsPtr);
  Abc_Print((int)vOutsPtr,"%s =","Partitioned fraiging time");
  level = 3;
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(level,"%9.2f sec\n",(double)(lVar7 + lVar6) / 1000000.0);
  return;
}

Assistant:

void Abc_NtkFraigPartitionedTime( Abc_Ntk_t * pNtk, void * pParams )
{
    Vec_Ptr_t * vParts, * vFraigs, * vOnePtr;
    Vec_Int_t * vOne;
    Abc_Ntk_t * pNtkAig, * pNtkFraig;
    int i;
    abctime clk = Abc_Clock();

    // perform partitioning
    assert( Abc_NtkIsStrash(pNtk) );
//    vParts = Abc_NtkPartitionNaive( pNtk, 20 );
    vParts = Abc_NtkPartitionSmart( pNtk, 300, 0 );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "unset progressbar" );

    // fraig each partition
    vOnePtr = Vec_PtrAlloc( 1000 );
    vFraigs = Vec_PtrAlloc( Vec_PtrSize(vParts) );
    Vec_PtrForEachEntry( Vec_Int_t *, vParts, vOne, i )
    {
        Abc_NtkConvertCos( pNtk, vOne, vOnePtr );
        pNtkAig = Abc_NtkCreateConeArray( pNtk, vOnePtr, 0 );
        pNtkFraig = Abc_NtkFraig( pNtkAig, pParams, 0, 0 );
        Vec_PtrPush( vFraigs, pNtkFraig );
        Abc_NtkDelete( pNtkAig );

        printf( "Finished part %5d (out of %5d)\r", i+1, Vec_PtrSize(vParts) );
    }
    Vec_VecFree( (Vec_Vec_t *)vParts );

    Cmd_CommandExecute( Abc_FrameGetGlobalFrame(), "set progressbar" );

    // derive the final network
    Vec_PtrForEachEntry( Abc_Ntk_t *, vFraigs, pNtkAig, i )
        Abc_NtkDelete( pNtkAig );
    Vec_PtrFree( vFraigs );
    Vec_PtrFree( vOnePtr );
    ABC_PRT( "Partitioned fraiging time", Abc_Clock() - clk );
}